

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loader.c
# Opt level: O3

plugin loader_get_impl_plugin(char *tag)

{
  int iVar1;
  plugin ppVar2;
  loader_impl impl;
  
  ppVar2 = plugin_manager_get(&loader_manager,tag);
  if (ppVar2 == (plugin)0x0) {
    impl = loader_impl_create(tag);
    if (impl != (loader_impl)0x0) {
      iVar1 = loader_impl_get_option_host(impl);
      if (iVar1 == 0) {
        loader_impl_dependencies(impl);
      }
      ppVar2 = plugin_manager_create(&loader_manager,tag,impl,loader_impl_destroy_dtor);
      if (ppVar2 != (plugin)0x0) {
        loader_impl_attach(impl,ppVar2);
        return ppVar2;
      }
      loader_impl_destroy((plugin)0x0,impl);
    }
    ppVar2 = (plugin)0x0;
    log_write_impl_va("metacall",0x124,"loader_get_impl_plugin",
                      "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/loader/source/loader.c"
                      ,LOG_LEVEL_ERROR,"Failed to create loader: %s",tag);
  }
  return ppVar2;
}

Assistant:

plugin loader_get_impl_plugin(const loader_tag tag)
{
	plugin p = plugin_manager_get(&loader_manager, tag);

	if (p != NULL)
	{
		return p;
	}

	loader_impl impl = loader_impl_create(tag);

	if (impl == NULL)
	{
		goto loader_create_error;
	}

	/* Dynamic link loader dependencies if it is not host */
	if (loader_impl_get_option_host(impl) == 0)
	{
		loader_impl_dependencies(impl);
	}

	/* Dynamic link the loader */
	p = plugin_manager_create(&loader_manager, tag, impl, &loader_impl_destroy_dtor);

	if (p == NULL)
	{
		goto plugin_manager_create_error;
	}

	/* Store in the loader implementation the reference to the plugin which belongs to */
	loader_impl_attach(impl, p);

	/* TODO: Disable logs here until log is completely thread safe and async signal safe */
	/* log_write("metacall", LOG_LEVEL_DEBUG, "Created loader (%s) implementation <%p>", tag, (void *)impl); */

	return p;

plugin_manager_create_error:
	loader_impl_destroy(p, impl);
loader_create_error:
	log_write("metacall", LOG_LEVEL_ERROR, "Failed to create loader: %s", tag);
	return NULL;
}